

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O3

void __thiscall
CppCNN::backprop_conv
          (CppCNN *this,MatrixXd *delta_prev_fc,AllLayersValuesBatch *Z_batch,
          AllLayersValuesBatch *A_batch)

{
  pointer pvVar1;
  pointer pvVar2;
  double *pdVar3;
  pointer psVar4;
  long *plVar5;
  long lVar6;
  int iVar7;
  LayerConv *pLVar8;
  LayerPool *this_00;
  LayerConv *pLVar9;
  CppCNN *pCVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  size_t sVar14;
  VectorXd v_delta_prev_fc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_100;
  ImageVolume local_f8;
  undefined1 local_d8 [16];
  pointer local_c8;
  CppCNN *local_c0;
  undefined1 local_b8 [88];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  pointer local_58;
  LayerSize local_48;
  
  pvVar1 = (A_batch->
           super__Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_f8.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar2 = pvVar1[-1].
           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar12 = *(long *)&((pvVar1[-1].
                       super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->
                     super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     )._M_impl.super__Vector_impl_data;
  local_48.channels =
       (int)((ulong)((long)pvVar2[-1].
                           super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)pvVar2[-1].
                          super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  local_48.rows = *(Index *)(lVar12 + 8);
  local_48.cols = *(Index *)(lVar12 + 0x10);
  local_c0 = this;
  local_b8._64_8_ = Z_batch;
  local_b8._72_8_ = A_batch;
  if (0 < (delta_prev_fc->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols) {
    sVar14 = 0;
    do {
      pdVar3 = (delta_prev_fc->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
               m_storage.m_data;
      local_b8._8_8_ =
           (delta_prev_fc->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_rows;
      local_b8._0_8_ = pdVar3 + local_b8._8_8_ * sVar14;
      if ((long)local_b8._8_8_ < 0 && pdVar3 != (double *)0x0) {
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/MapBase.h"
                      ,0xb0,
                      "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, -1, 1, true>, Level = 0]"
                     );
      }
      local_b8._32_8_ = (pointer)0x0;
      pCVar10 = (CppCNN *)local_b8;
      local_b8._24_8_ = delta_prev_fc;
      local_b8._40_8_ = sVar14;
      local_b8._48_8_ = local_b8._8_8_;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,1,true>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_d8,
                 (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                  *)local_b8);
      unflatten_layer((LayerValues *)local_b8,pCVar10,(VectorXd *)local_d8,&local_48);
      std::
      vector<std::vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,std::allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>,std::allocator<std::vector<Eigen::Matrix<double,-1,-1,0,-1,-1>,std::allocator<Eigen::Matrix<double,-1,-1,0,-1,-1>>>>>
      ::
      emplace_back<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>
                ((vector<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>,std::allocator<std::vector<Eigen::Matrix<double,_1,_1,0,_1,_1>,std::allocator<Eigen::Matrix<double,_1,_1,0,_1,_1>>>>>
                  *)&local_f8,
                 (vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  *)local_b8);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 *)local_b8);
      free((void *)local_d8._0_8_);
      sVar14 = sVar14 + 1;
    } while ((long)sVar14 <
             (delta_prev_fc->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_cols);
  }
  lVar12 = (long)(local_c0->__layers).
                 super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(local_c0->__layers).
                 super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4;
  if (0 < lVar12) {
    uVar11 = lVar12 + 1;
    pCVar10 = local_c0;
    lVar13 = lVar12 << 4;
    lVar12 = lVar12 * 0x18;
    do {
      psVar4 = (pCVar10->__layers).
               super__Vector_base<std::shared_ptr<LayerBase>,_std::allocator<std::shared_ptr<LayerBase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = (**(code **)(**(long **)((long)&psVar4[-1].
                                              super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_ptr + lVar13) + 0x20))();
      plVar5 = *(long **)((long)&psVar4[-1].
                                 super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         lVar13);
      if (iVar7 == 1) {
        if (plVar5 == (long *)0x0) {
          pLVar8 = (LayerConv *)0x0;
LAB_0010f925:
          local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pLVar9 = pLVar8;
        }
        else {
          pLVar8 = (LayerConv *)__dynamic_cast(plVar5,&LayerBase::typeinfo,&LayerConv::typeinfo,0);
          local_100 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pLVar9 = (LayerConv *)0x0;
          if (pLVar8 != (LayerConv *)0x0) {
            local_100 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                         ((long)&psVar4[-1].
                                 super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + lVar13);
            if (local_100 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_0010f925;
            pLVar9 = pLVar8;
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_100->_M_use_count = local_100->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_100->_M_use_count = local_100->_M_use_count + 1;
            }
          }
        }
        LayerConv::compute_gradients
                  (pLVar9,(ImageVolume *)
                          ((long)&(((_Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
                                     *)local_b8._72_8_)->_M_impl).super__Vector_impl_data._M_start
                                  [-1].
                                  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data + lVar12),&local_f8);
        pvVar1 = (((_Vector_base<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_std::allocator<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_>_>
                    *)local_b8._64_8_)->_M_impl).super__Vector_impl_data._M_start;
        plVar5 = *(long **)((long)&pvVar1[-1].
                                   super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data + lVar12);
        lVar6 = *plVar5;
        local_d8._0_8_ = *(long *)(lVar6 + 8);
        local_d8._8_8_ = *(long *)(lVar6 + 0x10);
        local_c8 = (pointer)CONCAT44(local_c8._4_4_,
                                     (int)((ulong)(plVar5[1] - lVar6) >> 3) * -0x55555555);
        LayerConv::convolution_backward
                  ((ImageVolume *)(local_b8 + 0x50),pLVar9,&local_f8,
                   (ImageVolume *)
                   ((long)&pvVar1[-1].
                           super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                           ._M_impl.super__Vector_impl_data + lVar12),(LayerSize *)local_d8);
        local_b8._16_8_ =
             local_f8.
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_b8._8_8_ =
             local_f8.
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_b8._0_8_ =
             local_f8.
             super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_f8.
        super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = local_58;
        local_f8.
        super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_b8._80_8_;
        local_f8.
        super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_60;
        local_b8._80_8_ = (element_type *)0x0;
        p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_58 = (pointer)0x0;
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                   *)local_b8);
        std::
        vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
        ::~vector((ImageVolume *)(local_b8 + 0x50));
        pCVar10 = local_c0;
joined_r0x0010f98e:
        if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100);
        }
      }
      else {
        iVar7 = (**(code **)(*plVar5 + 0x20))();
        if (iVar7 == 2) {
          this_00 = (LayerPool *)
                    __dynamic_cast(*(undefined8 *)
                                    ((long)&psVar4[-1].
                                            super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_ptr + lVar13),&LayerBase::typeinfo,
                                   &LayerPool::typeinfo,0);
          local_100 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&psVar4[-1].super___shared_ptr<LayerBase,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + lVar13);
          if (local_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              local_100->_M_use_count = local_100->_M_use_count + 1;
              UNLOCK();
            }
            else {
              local_100->_M_use_count = local_100->_M_use_count + 1;
            }
          }
          LayerPool::unpool((ImageVolume *)local_d8,this_00,&local_f8);
          local_b8._16_8_ =
               local_f8.
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_b8._8_8_ =
               local_f8.
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_b8._0_8_ =
               local_f8.
               super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_f8.
          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = local_c8;
          local_f8.
          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_d8._0_8_;
          local_f8.
          super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_d8._8_8_;
          local_d8._0_8_ = (element_type *)0x0;
          local_d8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_c8 = (pointer)0x0;
          std::
          vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
          ::~vector((vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
                     *)local_b8);
          std::
          vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
          ::~vector((ImageVolume *)local_d8);
          goto joined_r0x0010f98e;
        }
      }
      uVar11 = uVar11 - 1;
      lVar13 = lVar13 + -0x10;
      lVar12 = lVar12 + -0x18;
    } while (1 < uVar11);
  }
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::~vector(&local_f8);
  return;
}

Assistant:

void CppCNN::backprop_conv(const MatrixXd& delta_prev_fc, 
							 const AllLayersValuesBatch& Z_batch, const AllLayersValuesBatch& A_batch) {
	auto& A = A_batch.back();
	auto& Z = Z_batch.back();

	ImageVolume DeltaPrev;
	auto& lv_fc = A[0][0]; // one of layer values before fully-connected layer.
	auto lv_fc_sz = LayerSize(lv_fc.rows(), lv_fc.cols(), A.back().size());
	for (auto i = 0; i < delta_prev_fc.cols(); i++) {
		VectorXd v_delta_prev_fc = delta_prev_fc.col(i);
		DeltaPrev.push_back(unflatten_layer(v_delta_prev_fc, lv_fc_sz));
	}
	
	for (int64_t i = __layers.size() - 1; i >= 0; i--) {
		auto& p_layer = __layers[i];
		if (is_conv_layer(*p_layer)) {
			const auto& layer_conv = dynamic_pointer_cast<LayerConv>(p_layer);

			layer_conv->compute_gradients(A_batch[i], DeltaPrev);

			// compute next layer's dZ from current layer's dZ, direction : dZ^{l-1} <-- dZ^{l}
			auto& img = Z_batch[i][0][0];
			auto next_layer_size = LayerSize(img.rows(), img.cols(), Z_batch[i][0].size());
			DeltaPrev = layer_conv->convolution_backward(DeltaPrev, Z_batch[i], next_layer_size);
		}
		else if (is_pool_layer(*p_layer)) {
			const auto& layer_pool = dynamic_pointer_cast<LayerPool>(p_layer);
			DeltaPrev = layer_pool->unpool(DeltaPrev);
		}
	}
}